

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_backend.c
# Opt level: O0

int sk_BIGNUM_num(stack_st_BIGNUM *sk)

{
  int iVar1;
  OPENSSL_STACK *in_RDI;
  
  iVar1 = OPENSSL_sk_num(in_RDI);
  return iVar1;
}

Assistant:

DEFINE_STACK_OF(BIGNUM)

static int collect_numbers(STACK_OF(BIGNUM) *numbers,
                           const OSSL_PARAM params[], const char *names[])
{
    const OSSL_PARAM *p = NULL;
    int i;

    if (numbers == NULL)
        return 0;

    for (i = 0; names[i] != NULL; i++){
        p = OSSL_PARAM_locate_const(params, names[i]);
        if (p != NULL) {
            BIGNUM *tmp = NULL;

            if (!OSSL_PARAM_get_BN(p, &tmp)
                || sk_BIGNUM_push(numbers, tmp) == 0)
                return 0;
        }
    }

    return 1;
}